

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_test.cc
# Opt level: O3

void basic_test(void)

{
  char *__format;
  atomic<unsigned_char> counter_8;
  atomic<unsigned_short> counter_16;
  atomic<unsigned_int> counter_32;
  atomic<unsigned_long> counter_64;
  timeval __test_begin;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  LOCK();
  UNLOCK();
  __format = "%s PASSED\n";
  if (basic_test()::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"basic test");
  return;
}

Assistant:

void basic_test()
{
    TEST_INIT();

    atomic_uint64_t counter_64;
    uint64_t val_64 = 0, val_64_new = 200;
    int64_t delta_64 = 10;
    atomic_init_uint64_t(&counter_64, val_64);
    val_64 = 100;
    atomic_store_uint64_t(&counter_64, val_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 100);
    atomic_cas_uint64_t(&counter_64, val_64, val_64_new);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 200);
    atomic_incr_uint64_t(&counter_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 201);
    atomic_decr_uint64_t(&counter_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 200);
    atomic_add_uint64_t(&counter_64, delta_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 210);
    atomic_sub_uint64_t(&counter_64, delta_64);
    TEST_CHK(atomic_get_uint64_t(&counter_64) == 200);

    atomic_uint32_t counter_32;
    uint32_t val_32 = 0, val_32_new = 200;
    int32_t delta_32 = 10;
    atomic_init_uint32_t(&counter_32, val_32);
    val_32 = 100;
    atomic_store_uint32_t(&counter_32, val_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 100);
    atomic_cas_uint32_t(&counter_32, val_32, val_32_new);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 200);
    atomic_incr_uint32_t(&counter_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 201);
    atomic_decr_uint32_t(&counter_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 200);
    atomic_add_uint32_t(&counter_32, delta_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 210);
    atomic_sub_uint32_t(&counter_32, delta_32);
    TEST_CHK(atomic_get_uint32_t(&counter_32) == 200);

    atomic_uint16_t counter_16;
    uint16_t val_16 = 0, val_16_new = 200;
    int16_t delta_16 = 10;
    atomic_init_uint16_t(&counter_16, val_16);
    val_16 = 100;
    atomic_store_uint16_t(&counter_16, val_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 100);
    atomic_cas_uint16_t(&counter_16, val_16, val_16_new);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 200);
    atomic_incr_uint16_t(&counter_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 201);
    atomic_decr_uint16_t(&counter_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 200);
    atomic_add_uint16_t(&counter_16, delta_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 210);
    atomic_sub_uint16_t(&counter_16, delta_16);
    TEST_CHK(atomic_get_uint16_t(&counter_16) == 200);

    atomic_uint8_t counter_8;
    uint8_t val_8 = 0, val_8_new = 100;
    int8_t delta_8 = 10;
    atomic_init_uint8_t(&counter_8, val_8);
    val_8 = 50;
    atomic_store_uint8_t(&counter_8, val_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 50);
    atomic_cas_uint8_t(&counter_8, val_8, val_8_new);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 100);
    atomic_incr_uint8_t(&counter_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 101);
    atomic_decr_uint8_t(&counter_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 100);
    atomic_add_uint8_t(&counter_8, delta_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 110);
    atomic_sub_uint8_t(&counter_8, delta_8);
    TEST_CHK(atomic_get_uint8_t(&counter_8) == 100);

    TEST_RESULT("basic test");
}